

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_throwable.c
# Opt level: O3

throwable throwable_create(value v)

{
  type_id tVar1;
  throwable __ptr;
  throwable ptVar2;
  value pvVar3;
  
  __ptr = (throwable)malloc(8);
  if (__ptr != (throwable)0x0) {
    if (v == (value)0x0) {
      pvVar3 = value_create_null();
    }
    else {
      tVar1 = value_type_id(v);
      if (tVar1 != 0x12) {
        __ptr->v = v;
        return __ptr;
      }
      ptVar2 = value_to_throwable(v);
      pvVar3 = value_type_copy(ptVar2->v);
    }
    __ptr->v = pvVar3;
    if (pvVar3 != (value)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (throwable)0x0;
}

Assistant:

throwable throwable_create(value v)
{
	throwable th = malloc(sizeof(struct throwable_type));

	if (th == NULL)
	{
		return NULL;
	}

	if (v == NULL)
	{
		/* In case of NULL, create a default throwable with a null value */
		th->v = value_create_null();
	}
	else if (value_type_id(v) == TYPE_THROWABLE)
	{
		/* This will flatten the type so it does not enter into a recursive state */
		throwable inner = value_to_throwable(v);

		/* Copy the the value from the throwable passed in the constructor */
		th->v = value_type_copy(inner->v);
	}
	else
	{
		/* Otherwise just set the value (it is supposed to be copied or allocated from outside of this constructor) */
		th->v = v;
	}

	if (th->v == NULL)
	{
		free(th);
		return NULL;
	}

	return th;
}